

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HasExplicitObjectName(cmGeneratorTarget *this,cmSourceFile *file)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  cmSourceFile *file_local;
  cmGeneratorTarget *this_local;
  
  it._M_node = (_Base_ptr)file;
  ComputeObjectMapping(this);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
       ::find(&this->ExplicitObjectName,(key_type *)&it);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
       ::end(&this->ExplicitObjectName);
  bVar1 = std::operator!=(&local_20,&local_28);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasExplicitObjectName(cmSourceFile const* file) const
{
  const_cast<cmGeneratorTarget*>(this)->ComputeObjectMapping();
  std::set<cmSourceFile const*>::const_iterator it
                                        = this->ExplicitObjectName.find(file);
  return it != this->ExplicitObjectName.end();
}